

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

boolean drown(void)

{
  boolean bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  int tmp;
  int iVar9;
  bool bVar10;
  boolean lost;
  undefined8 uStack_38;
  
  bVar10 = true;
  uStack_38 = in_RAX;
  if (((u._1052_1_ & 2) != 0) && (bVar1 = is_pool(level,(int)u.ux0,(int)u.uy0), bVar1 != '\0')) {
    if ((u.uprops[0x39].extrinsic == 0 && u.uprops[0x39].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 2) == 0)) {
      if (u.usteed == (monst *)0x0) {
        if (u.uprops[0x31].intrinsic == 0) goto LAB_002697d1;
      }
      else if (((u.usteed)->data->mflags1 & 2) == 0 && u.uprops[0x31].intrinsic == 0) {
LAB_002697d1:
        if (((youmonst.data)->mflags1 & 0x600) == 0 && u.uprops[0x31].extrinsic == 0)
        goto LAB_002697f6;
      }
    }
    uVar3 = mt_random();
    bVar10 = false;
    if (0x33333333 < uVar3 * -0x33333333) {
      return '\0';
    }
  }
LAB_002697f6:
  if ((u._1052_1_ & 2) == 0) {
    bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
    pcVar8 = "plunge";
    if (bVar1 == '\0') {
      pcVar8 = "fall";
    }
    uVar5 = 0x2e;
    if ((((u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 0x600) == 0)) && (((youmonst.data)->mflags1 & 2) == 0)) &&
       ((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)))) {
      if (u.usteed == (monst *)0x0) {
        uVar5 = 0x21;
      }
      else {
        uVar5 = 0x2e;
        if (((u.usteed)->data->mflags1 & 2) == 0) {
          uVar5 = 0x21;
        }
      }
    }
    pline("You %s into the water%c",pcVar8,uVar5);
    if ((((u.uprops[0x39].extrinsic == 0 && u.uprops[0x39].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 2) == 0)) &&
        ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) &&
       (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         (u.umonnum != u.umonster)) {
        dmgtype(youmonst.data,0x24);
      }
      pline("You sink like %s.");
    }
  }
  water_damage(invent,'\0','\0');
  if ((u.umonnum == 0x29) && (uVar3 = mt_random(), 0x55555555 < uVar3 * -0x55555555)) {
    split_mon(&youmonst,(monst *)0x0);
  }
  else if (u.umonnum == 0x10a) {
    pline("You rust!");
    iVar4 = 2;
    iVar9 = -2;
    do {
      uVar3 = mt_random();
      iVar4 = iVar4 + uVar3 % 6;
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
    if (u.mhmax - iVar4 != 0 && iVar4 <= u.mhmax) {
      u.mhmax = u.mhmax - iVar4;
    }
    losehp(iVar4,"rusting away",1);
  }
  if (!bVar10) {
    return '\0';
  }
  iVar4 = number_leashed();
  if (0 < iVar4) {
    pcVar8 = "es";
    if (iVar4 == 1) {
      pcVar8 = "";
    }
    pcVar6 = "s";
    if (iVar4 != 1) {
      pcVar6 = "";
    }
    pline("The leash%s slip%s loose.",pcVar8,pcVar6);
    unleash_all();
  }
  if (u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) {
    uVar3 = (youmonst.data)->mflags1;
    if (((((uVar3 & 2) == 0) && ((uVar3 & 0x600) == 0)) &&
        ((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)))) &&
       ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) {
      if (((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
          ((uVar3 >> 0x19 & 1) != 0)) &&
         ((u.usleep == 0 &&
          ((((uVar3 & 0x4000000) != 0 || u.uprops[0xf].extrinsic != 0) ||
            u.uprops[0xf].intrinsic != 0 ||
           (uVar3 = mt_random(), (int)(uVar3 % 3) < (int)u.uluck + (int)u.moreluck + 2)))))) {
        pline("You attempt a teleport spell.");
        if (((level->flags).field_0x9 & 8) == 0) {
          dotele();
          bVar1 = is_pool(level,(int)u.ux,(int)u.uy);
          if (bVar1 == '\0') {
            return '\x01';
          }
        }
        else {
          pline("The attempted teleport spell fails.");
        }
      }
      if (u.usteed != (monst *)0x0) {
        dismount_steed(0);
        bVar1 = is_pool(level,(int)u.ux,(int)u.uy);
        if (bVar1 == '\0') {
          return '\x01';
        }
      }
      if (u.usleep != 0) {
        unmul("Suddenly you wake up!");
      }
      iVar4 = 0;
      bVar10 = true;
      if ((multi < 0) || ((u.umonnum != u.umonster && ((youmonst.data)->mmove == '\0')))) {
        iVar9 = 0;
      }
      else {
        iVar7 = 100;
        do {
          uVar3 = mt_random();
          iVar4 = (int)u.ux + uVar3 % 3 + -1;
          uVar3 = mt_random();
          iVar9 = (int)u.uy + uVar3 % 3 + -1;
          bVar1 = goodpos(level,iVar4,iVar9,&youmonst,0);
          if (bVar1 != '\0') goto LAB_00269dd9;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        iVar4 = u.ux + -1;
        if (iVar4 <= u.ux + 1) {
          do {
            iVar9 = u.uy + -1;
            if (iVar9 <= u.uy + 1) {
              do {
                bVar1 = goodpos(level,iVar4,iVar9,&youmonst,0);
                if (bVar1 != '\0') goto LAB_00269dd9;
                iVar7 = iVar9 + 1;
                bVar10 = iVar9 <= u.uy;
                iVar9 = iVar7;
              } while (bVar10);
            }
            iVar7 = iVar4 + 1;
            bVar10 = iVar4 <= u.ux;
            iVar4 = iVar7;
          } while (bVar10);
        }
        bVar10 = true;
      }
LAB_00269ddb:
      if (!bVar10) {
        uStack_38 = uStack_38 & 0xffffffffffffff;
        bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
        if (bVar1 == '\0') {
          bVar1 = emergency_disrobe((boolean *)((long)&uStack_38 + 7));
          bVar10 = bVar1 == '\0';
        }
        else {
          bVar10 = false;
        }
        pline("You try to crawl out of the water.");
        if (uStack_38._7_1_ != '\0') {
          pline("You dump some of your gear to lose weight...");
        }
        if (!bVar10) {
          pline("Pheew!  That was close.");
          teleds(iVar4,iVar9,'\x01');
          return '\x01';
        }
        pline("But in vain.");
      }
      u._1052_1_ = u._1052_1_ | 2;
      if ((((u.umonnum != u.umonster) && (u.uprops[0x3d].intrinsic == 0)) &&
          (u.uprops[0x3d].extrinsic == 0)) && (urace.malenum == 0xe8)) {
        rehumanize();
        u._1052_1_ = u._1052_1_ & 0xfd;
        return '\x01';
      }
      pline("You drown.");
      killer_format = 0;
      if (level->locations[u.ux][u.uy].typ == '\x11') {
        killer = "pool of water";
      }
      else {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_medusa_level);
        killer = "pool of water";
        if (bVar1 == '\0') {
          killer = "moat";
        }
      }
      done(4);
      cVar2 = safe_teleds('\x01');
      while (cVar2 == '\0') {
        pline("You\'re still drowning.");
        done(4);
        cVar2 = safe_teleds('\x01');
      }
      if ((u._1052_1_ & 2) == 0) {
        return '\x01';
      }
      u._1052_1_ = u._1052_1_ & 0xfd;
      bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
      pcVar8 = "in an air bubble";
      if (bVar1 == '\0') {
        pcVar8 = "on land";
      }
      pline("You find yourself back %s.",pcVar8);
      return '\x01';
    }
    if ((u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 0x600) == 0)) goto LAB_00269c1d;
  }
  if (flags.verbose != '\0') {
    pline("But you aren\'t drowning.");
  }
  bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar1 == '\0') {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((pcVar8 = "Your keel hits the bottom.", u.umonnum != u.umonster &&
        (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      pcVar8 = "You touch bottom.";
    }
    pline(pcVar8);
  }
LAB_00269c1d:
  if (uball != (obj *)0x0) {
    unplacebc();
    placebc();
  }
  vision_recalc(2);
  u._1052_1_ = u._1052_1_ | 2;
  under_water(1);
  vision_full_recalc = '\x01';
  return '\0';
LAB_00269dd9:
  bVar10 = false;
  goto LAB_00269ddb;
}

Assistant:

boolean drown(void)
{
	boolean inpool_ok = FALSE, crawl_ok;
	int i, x, y;

	/* happily wading in the same contiguous pool */
	if (u.uinwater && is_pool(level, u.ux0, u.uy0) &&
	    (Swimming || Amphibious)) {
		/* water effects on objects every now and then */
		if (!rn2(5)) inpool_ok = TRUE;
		else return FALSE;
	}

	if (!u.uinwater) {
	    pline("You %s into the water%c",
		Is_waterlevel(&u.uz) ? "plunge" : "fall",
		Amphibious || Swimming ? '.' : '!');
	    if (!Swimming && !Is_waterlevel(&u.uz))
		    pline("You sink like %s.",
			Hallucination ? "the Titanic" : "a rock");
	}

	water_damage(invent, FALSE, FALSE);

	if (u.umonnum == PM_GREMLIN && rn2(3))
	    split_mon(&youmonst, NULL);
	else if (u.umonnum == PM_IRON_GOLEM) {
	    pline("You rust!");
	    i = dice(2,6);
	    if (u.mhmax > i) u.mhmax -= i;
	    losehp(i, "rusting away", KILLED_BY);
	}
	if (inpool_ok) return FALSE;

	if ((i = number_leashed()) > 0) {
		pline("The leash%s slip%s loose.",
			(i > 1) ? "es" : "",
			(i > 1) ? "" : "s");
		unleash_all();
	}

	if (Amphibious || Swimming) {
		if (Amphibious) {
			if (flags.verbose)
				pline("But you aren't drowning.");
			if (!Is_waterlevel(&u.uz)) {
				if (Hallucination)
					pline("Your keel hits the bottom.");
				else
					pline("You touch bottom.");
			}
		}
		if (Punished) {
			unplacebc();
			placebc();
		}
		vision_recalc(2);	/* unsee old position */
		u.uinwater = 1;
		under_water(1);
		vision_full_recalc = 1;
		return FALSE;
	}
	if ((Teleportation || can_teleport(youmonst.data)) &&
		    !u.usleep && (Teleport_control || rn2(3) < Luck+2)) {
		pline("You attempt a teleport spell.");	/* utcsri!carroll */
		if (!level->flags.noteleport) {
			dotele();
			if (!is_pool(level, u.ux,u.uy))
				return TRUE;
		} else pline("The attempted teleport spell fails.");
	}
	if (u.usteed) {
		dismount_steed(DISMOUNT_GENERIC);
		if (!is_pool(level, u.ux,u.uy))
			return TRUE;
	}
	crawl_ok = FALSE;
	x = y = 0;		/* lint suppression */
	/* if sleeping, wake up now so that we don't crawl out of water
	   while still asleep; we can't do that the same way that waking
	   due to combat is handled; note unmul() clears u.usleep */
	if (u.usleep) unmul("Suddenly you wake up!");
	/* can't crawl if unable to move (crawl_ok flag stays false) */
	if (multi < 0 || (Upolyd && !youmonst.data->mmove)) goto crawl;
	/* look around for a place to crawl to */
	for (i = 0; i < 100; i++) {
		x = rn1(3,u.ux - 1);
		y = rn1(3,u.uy - 1);
		if (goodpos(level, x, y, &youmonst, 0)) {
			crawl_ok = TRUE;
			goto crawl;
		}
	}
	/* one more scan */
	for (x = u.ux - 1; x <= u.ux + 1; x++)
		for (y = u.uy - 1; y <= u.uy + 1; y++)
			if (goodpos(level, x, y, &youmonst, 0)) {
				crawl_ok = TRUE;
				goto crawl;
			}
 crawl:
	if (crawl_ok) {
		boolean lost = FALSE;
		/* time to do some strip-tease... */
		boolean succ = Is_waterlevel(&u.uz) ? TRUE :
				emergency_disrobe(&lost);

		pline("You try to crawl out of the water.");
		if (lost)
			pline("You dump some of your gear to lose weight...");
		if (succ) {
			pline("Pheew!  That was close.");
			teleds(x,y,TRUE);
			return TRUE;
		}
		/* still too much weight */
		pline("But in vain.");
	}
	u.uinwater = 1;
	/* [ALI] Vampires return to vampiric form on drowning. */
	if (Upolyd && !Unchanging && Race_if(PM_VAMPIRE)) {
		rehumanize();
		u.uinwater = 0;
		/* should be unnecessary as spoteffects() should get called */
		/* pline("You fly up out of the water!"); */
		return TRUE;
	}
	pline("You drown.");
	killer_format = KILLED_BY_AN;
	killer = (level->locations[u.ux][u.uy].typ == POOL || Is_medusa_level(&u.uz)) ?
	    "pool of water" : "moat";
	done(DROWNING);
	/* oops, we're still alive.  better get out of the water. */
	while (!safe_teleds(TRUE)) {
		pline("You're still drowning.");
		done(DROWNING);
	}
	if (u.uinwater) {
		u.uinwater = 0;
		pline("You find yourself back %s.",
		      Is_waterlevel(&u.uz) ? "in an air bubble" : "on land");
	}
	return TRUE;
}